

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O2

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::RenameViewInfo::Copy(RenameViewInfo *this)

{
  AlterInfo *in_RSI;
  AlterEntryData local_80;
  
  AlterInfo::GetAlterEntryData(&local_80,in_RSI);
  make_uniq_base<duckdb::AlterInfo,duckdb::RenameViewInfo,duckdb::AlterEntryData,std::__cxx11::string_const&>
            ((duckdb *)this,&local_80,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 1));
  AlterEntryData::~AlterEntryData(&local_80);
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<AlterInfo> RenameViewInfo::Copy() const {
	return make_uniq_base<AlterInfo, RenameViewInfo>(GetAlterEntryData(), new_view_name);
}